

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O0

void __thiscall
TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
TPZParFrontMatrix(TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                  *this,TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                        *cp)

{
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_> *in_RSI
  ;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
  *unaff_retaddr;
  TPZStack<TPZEqnArray<long_double>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<long_double,TPZStackEqnStorage<long_double>,TPZFrontNonSym<long_double>>>
            (in_RDI,0x21);
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
  TPZFrontMatrix(unaff_retaddr,(void **)vtt,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02553be8;
  TPZStack<TPZEqnArray<long_double>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x334f8) = 0;
  *(undefined8 *)(in_RDI + 0x33510) = 0;
  *(undefined8 *)(in_RDI + 0x33518) = 0;
  *(undefined8 *)(in_RDI + 0x33500) = 0;
  *(undefined8 *)(in_RDI + 0x33508) = 0;
  *(undefined8 *)(in_RDI + 0x33520) = 0;
  std::mutex::mutex((mutex *)0x1d41083);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x33528));
  TPZManVector<TPZEqnArray<long_double>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<long_double>_*,_10> *)in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}